

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O2

void testPreviewImage(string *tempDir)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  PreviewRgba *pPVar4;
  PreviewRgba *pPVar5;
  PreviewRgba *pPVar6;
  bool bVar7;
  int iVar8;
  PreviewRgba PVar9;
  ostream *poVar10;
  Header *pHVar11;
  Box2i *this;
  long lVar12;
  PreviewImage *pPVar13;
  Box2i *src;
  int x;
  int iVar14;
  PreviewRgba PVar15;
  long lVar16;
  int iVar17;
  size_t yStride;
  int iVar18;
  size_t yStride_00;
  int y;
  long lVar19;
  PreviewImage preview1;
  Array<Imf_2_5::Rgba> pixels1;
  RgbaInputFile file1;
  string filename2;
  string filename1;
  RgbaOutputFile file2;
  byte abStack_420 [488];
  Header header;
  
  std::operator+(&filename1,tempDir,"imf_preview1.exr");
  std::operator+(&filename2,tempDir,"imf_preview2.exr");
  poVar10 = std::operator<<((ostream *)&std::cout,"Testing preview image attribute");
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<((ostream *)&std::cout,"reading file ");
  poVar10 = std::operator<<(poVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/comp_piz.exr"
                           );
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar8 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            (&file1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/comp_piz.exr"
             ,iVar8);
  pHVar11 = Imf_2_5::RgbaInputFile::header(&file1);
  bVar7 = Imf_2_5::Header::hasPreviewImage(pHVar11);
  if (bVar7) {
    __assert_fail("!file1.header().hasPreviewImage()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x58,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  this = Imf_2_5::RgbaInputFile::dataWindow(&file1);
  lVar19 = (long)(this->min).x;
  yStride = ((this->max).x - lVar19) + 1;
  iVar8 = (this->min).y;
  Imf_2_5::Array<Imf_2_5::Rgba>::Array
            (&pixels1,(long)((((this->max).y - iVar8) + 1) * (int)yStride));
  lVar12 = (long)(iVar8 * (int)yStride);
  Imf_2_5::RgbaInputFile::setFrameBuffer(&file1,pixels1._data + (-lVar19 - lVar12),1,yStride);
  Imf_2_5::RgbaInputFile::readPixels(&file1,(this->min).y,(this->max).y);
  poVar10 = std::operator<<((ostream *)&std::cout,"generating preview image");
  std::endl<char,std::char_traits<char>>(poVar10);
  Imf_2_5::PreviewImage::PreviewImage(&preview1,0x80,0x40,(PreviewRgba *)0x0);
  PVar9.r = '\0';
  PVar9.g = '\0';
  PVar9.b = '\0';
  PVar9.a = 0x80;
  for (iVar8 = 0; iVar8 != 0x40; iVar8 = iVar8 + 1) {
    PVar15 = PVar9;
    for (iVar14 = 0; iVar14 != 0x80; iVar14 = iVar14 + 1) {
      preview1._pixels[preview1._width * iVar8 + iVar14] = PVar15;
      PVar15 = (PreviewRgba)((int)PVar15 + 0x10002);
    }
    PVar9 = (PreviewRgba)((int)PVar9 + 0x10400);
  }
  poVar10 = std::operator<<((ostream *)&std::cout,"writing file ");
  poVar10 = std::operator<<(poVar10,filename1._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar10);
  pHVar11 = Imf_2_5::RgbaInputFile::header(&file1);
  Imf_2_5::Header::Header(&header,pHVar11);
  Imf_2_5::Header::setPreviewImage(&header,&preview1);
  iVar8 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&file2,filename1._M_dataplus._M_p,&header,WRITE_RGBA,iVar8);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&file2,pixels1._data + (-lVar19 - lVar12),1,yStride);
  for (iVar8 = (this->min).y; iVar8 <= (this->max).y; iVar8 = iVar8 + 1) {
    Imf_2_5::RgbaOutputFile::writePixels(&file2,1);
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&file2);
  Imf_2_5::Header::~Header(&header);
  poVar10 = std::operator<<((ostream *)&std::cout,"reading file ");
  poVar10 = std::operator<<(poVar10,filename1._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar8 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&header,filename1._M_dataplus._M_p,iVar8);
  pHVar11 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&header);
  bVar7 = Imf_2_5::Header::hasPreviewImage(pHVar11);
  if (!bVar7) {
    __assert_fail("file2.header().hasPreviewImage()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x82,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  pHVar11 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)&header);
  pPVar13 = Imf_2_5::Header::previewImage(pHVar11);
  pPVar4 = pPVar13->_pixels;
  lVar16 = 0;
  do {
    if (lVar16 == 0x2000) {
      src = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&header);
      bVar7 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(this,src);
      if (!bVar7) {
        __assert_fail("dw == file2.dataWindow()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                      ,0x8e,
                      "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                     );
      }
      uVar3 = (this->max).x;
      iVar8 = (this->min).x;
      yStride_00 = ((long)(int)uVar3 - (long)iVar8) + 1;
      iVar14 = (this->min).y;
      iVar18 = (int)yStride_00;
      iVar17 = (((this->max).y - iVar14) + 1) * iVar18;
      Imf_2_5::Array<Imf_2_5::Rgba>::Array((Array<Imf_2_5::Rgba> *)&file2,(long)iVar17);
      Imf_2_5::RgbaInputFile::setFrameBuffer
                ((RgbaInputFile *)&header,
                 (Rgba *)((long)file2._outputFile + (long)(iVar14 * iVar18) * -8 + (long)iVar8 * -8)
                 ,1,yStride_00);
      Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&header,(this->min).y,(this->max).y);
      iVar17 = ~uVar3 + iVar8 + iVar17;
      while( true ) {
        iVar17 = iVar17 + iVar18;
        if (iVar17 < 1) {
          Imf_2_5::Array<Imf_2_5::Rgba>::~Array((Array<Imf_2_5::Rgba> *)&file2);
          Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&header);
          poVar10 = std::operator<<((ostream *)&std::cout,"writing file ");
          poVar10 = std::operator<<(poVar10,filename2._M_dataplus._M_p);
          std::endl<char,std::char_traits<char>>(poVar10);
          pHVar11 = Imf_2_5::RgbaInputFile::header(&file1);
          Imf_2_5::Header::Header(&header,pHVar11);
          Imf_2_5::PreviewImage::PreviewImage((PreviewImage *)&file2,0x80,0x40,(PreviewRgba *)0x0);
          Imf_2_5::Header::setPreviewImage(&header,(PreviewImage *)&file2);
          Imf_2_5::PreviewImage::~PreviewImage((PreviewImage *)&file2);
          iVar8 = Imf_2_5::globalThreadCount();
          Imf_2_5::RgbaOutputFile::RgbaOutputFile
                    (&file2,filename2._M_dataplus._M_p,&header,WRITE_RGBA,iVar8);
          Imf_2_5::RgbaOutputFile::setFrameBuffer
                    (&file2,pixels1._data + (-lVar19 - lVar12),1,yStride);
          for (iVar8 = (this->min).y; iVar8 <= (this->max).y; iVar8 = iVar8 + 1) {
            Imf_2_5::RgbaOutputFile::writePixels(&file2,1);
            if (iVar8 == ((this->max).y + (this->min).y) / 2) {
              Imf_2_5::RgbaOutputFile::updatePreviewImage(&file2,preview1._pixels);
            }
          }
          Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&file2);
          Imf_2_5::Header::~Header(&header);
          poVar10 = std::operator<<((ostream *)&std::cout,"comparing files ");
          poVar10 = std::operator<<(poVar10,filename1._M_dataplus._M_p);
          poVar10 = std::operator<<(poVar10," and ");
          poVar10 = std::operator<<(poVar10,filename2._M_dataplus._M_p);
          std::endl<char,std::char_traits<char>>(poVar10);
          std::ifstream::ifstream(&header);
          std::ifstream::ifstream(&file2);
          std::filebuf::open((char *)&header._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                      _M_parent,(_Ios_Openmode)filename1._M_dataplus._M_p);
          std::filebuf::open((char *)&file2._toYca,(_Ios_Openmode)filename2._M_dataplus._M_p);
          while( true ) {
            iVar8 = std::istream::get();
            iVar14 = std::istream::get();
            uVar3 = *(uint *)((long)&header._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_right + *(long *)(header._map._M_t._M_impl._0_8_ + -0x18));
            if ((uVar3 & 2) != 0) {
              std::ifstream::~ifstream(&file2);
              std::ifstream::~ifstream(&header);
              remove(filename1._M_dataplus._M_p);
              remove(filename2._M_dataplus._M_p);
              Imf_2_5::PreviewImage::~PreviewImage(&preview1);
              Imf_2_5::Array<Imf_2_5::Rgba>::~Array(&pixels1);
              Imf_2_5::RgbaInputFile::~RgbaInputFile(&file1);
              poVar10 = std::operator<<((ostream *)&std::cout,"ok\n");
              std::endl<char,std::char_traits<char>>(poVar10);
              std::__cxx11::string::~string((string *)&filename2);
              std::__cxx11::string::~string((string *)&filename1);
              return;
            }
            if (iVar8 != iVar14) break;
            if (((uVar3 & 5) != 0) || ((abStack_420[(long)file2._vptr_RgbaOutputFile[-3]] & 5) != 0)
               ) {
              __assert_fail("!!file2 && !!file3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                            ,0xc6,
                            "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                           );
            }
          }
          __assert_fail("c2 == c3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                        ,0xc5,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        fVar2 = *(float *)((long)&half::_toFloat + (ulong)((pixels1._data)->r)._h * 4);
        pfVar1 = (float *)((long)&half::_toFloat +
                          (ulong)*(ushort *)
                                  &((file2._outputFile)->super_GenericOutputFile).
                                   _vptr_GenericOutputFile * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("pixels1[i].r == pixels2[i].r",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                        ,0x9b,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        fVar2 = *(float *)((long)&half::_toFloat + (ulong)((pixels1._data)->g)._h * 4);
        pfVar1 = (float *)((long)&half::_toFloat +
                          (ulong)*(ushort *)
                                  ((long)&((file2._outputFile)->super_GenericOutputFile).
                                          _vptr_GenericOutputFile + 2) * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("pixels1[i].g == pixels2[i].g",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                        ,0x9c,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
        fVar2 = *(float *)((long)&half::_toFloat + (ulong)((pixels1._data)->b)._h * 4);
        pfVar1 = (float *)((long)&half::_toFloat +
                          (ulong)*(ushort *)
                                  ((long)&((file2._outputFile)->super_GenericOutputFile).
                                          _vptr_GenericOutputFile + 4) * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) break;
        fVar2 = *(float *)((long)&half::_toFloat + (ulong)((pixels1._data)->a)._h * 4);
        pfVar1 = (float *)((long)&half::_toFloat +
                          (ulong)*(ushort *)
                                  ((long)&((file2._outputFile)->super_GenericOutputFile).
                                          _vptr_GenericOutputFile + 6) * 4);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("pixels1[i].a == pixels2[i].a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                        ,0x9e,
                        "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                       );
        }
      }
      __assert_fail("pixels1[i].b == pixels2[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9d,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (preview1._pixels[lVar16].r != pPVar4[lVar16].r) {
      __assert_fail("preview1.pixels()[i].r == preview2.pixels()[i].r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x88,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (preview1._pixels[lVar16].g != pPVar4[lVar16].g) {
      __assert_fail("preview1.pixels()[i].g == preview2.pixels()[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x89,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (preview1._pixels[lVar16].b != pPVar4[lVar16].b) {
      __assert_fail("preview1.pixels()[i].b == preview2.pixels()[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x8a,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    pPVar5 = preview1._pixels + lVar16;
    pPVar6 = pPVar4 + lVar16;
    lVar16 = lVar16 + 1;
  } while (pPVar5->a == pPVar6->a);
  __assert_fail("preview1.pixels()[i].a == preview2.pixels()[i].a",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                ,0x8b,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
testPreviewImage (const std::string &tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
	cout << "Testing preview image attribute" << endl;

	readWriteFiles (ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
			filename1.c_str(),
			filename2.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}